

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O1

string * __thiscall
TOIFactoredRewardDecPOMDPDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,TOIFactoredRewardDecPOMDPDiscrete *this)

{
  char cVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  uint uVar5;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  TOIDecPOMDPDiscrete::SoftPrint_abi_cxx11_(&local_1e0,&this->super_TOIDecPOMDPDiscrete);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_TOIDecPOMDPDiscrete).field_0x2b8 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Reward models: ",0xf);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    uVar5 = 0;
    while( true ) {
      uVar2 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if (uVar2 == uVar5) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Individual rewards for agent ",0x1d);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (**(code **)(**(long **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 +
                              (ulong)uVar5 * 8) + 0x28))(&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return local_1c0;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar4 = &PTR__E_0059bd80;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar4 + 1),
             "TOIFactoredRewardDecPOMDPDiscrete components (reward model) not initialized","");
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

string TOIFactoredRewardDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TOIDecPOMDPDiscrete::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward models: " << endl;
        for(unsigned int i=0;i!=GetNrAgents();++i)
        {
            ss << "Individual rewards for agent " << i << endl;
            ss << _m_p_rModels[i]->SoftPrint();
        }
    }
    else
        throw E("TOIFactoredRewardDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}